

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O2

ProgramSources * __thiscall
vk::ProgramCollection<glu::ProgramSources>::add
          (ProgramCollection<glu::ProgramSources> *this,string *name)

{
  mapped_type pPVar1;
  mapped_type *ppPVar2;
  MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> prog;
  UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> local_28;
  
  de::details::newMovePtr<glu::ProgramSources>();
  ppPVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,name);
  *ppPVar2 = local_28.m_data.ptr;
  local_28.m_data.ptr = (ProgramSources *)0x0;
  ppPVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,name);
  pPVar1 = *ppPVar2;
  de::details::UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>::
  ~UniqueBase(&local_28);
  return pPVar1;
}

Assistant:

Program& ProgramCollection<Program>::add (const std::string& name)
{
	DE_ASSERT(!contains(name));
	de::MovePtr<Program> prog = de::newMovePtr<Program>();
	m_programs[name] = prog.get();
	prog.release();
	return *m_programs[name];
}